

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

bool __thiscall
SQCompilation::CheckerVisitor::hasDynamicContent(CheckerVisitor *this,SQObject *container)

{
  bool bVar1;
  SQObjectPtr val;
  SQObjectPtr key;
  SQObject local_38;
  SQObjectPtr local_20;
  
  if (container->_type == OT_TABLE) {
    SQObjectPtr::SQObjectPtr(&local_20,this->_ctx->_vm,"__dynamic_content__",-1);
    local_38._unVal.pTable = (SQTable *)0x0;
    local_38._type = OT_NULL;
    local_38._flags = '\0';
    local_38._5_3_ = 0;
    bVar1 = SQTable::Get((container->_unVal).pTable,&local_20,(SQObjectPtr *)&local_38);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_38);
    SQObjectPtr::~SQObjectPtr(&local_20);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool CheckerVisitor::hasDynamicContent(const SQObject &container) {
  if (!sq_istable(container))
    return false;
  SQObjectPtr key(_ctx.getVm(), "__dynamic_content__");
  SQObjectPtr val;
  return _table(container)->Get(key, val);
}